

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<tcb::rational<char>const&>::
captureExpression<(Catch::Internal::Operator)2,tcb::rational<char>>
          (ExpressionLhs<tcb::rational<char>const&> *this,rational<char> *rhs)

{
  ResultBuilder *pRVar1;
  rational<char> *_value;
  rational<char> *_value_00;
  allocator local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,
                      (int)rhs->denom_ * (int)**(char **)(this + 8) <
                      (int)(*(char **)(this + 8))[1] * (int)rhs->num_);
  Detail::StringMakerBase<true>::convert<tcb::rational<char>>
            (&local_38,*(StringMakerBase<true> **)(this + 8),_value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Detail::StringMakerBase<true>::convert<tcb::rational<char>>
            (&local_58,(StringMakerBase<true> *)rhs,_value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  std::__cxx11::string::string((string *)&local_78,"<",&local_79);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }